

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  pointer pOVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  const_iterator __begin3;
  pointer pOVar11;
  long lVar12;
  ulong uVar13;
  pointer pAVar14;
  long lVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ParserInfo parseInfos [512];
  undefined1 local_2178 [64];
  char *local_2138;
  size_type local_2130;
  char local_2128;
  undefined7 uStack_2127;
  undefined8 uStack_2120;
  TokenStream *local_2118;
  ulong local_2110;
  pointer local_2108;
  string *local_2100;
  undefined1 local_20f8 [16];
  undefined1 local_20e8 [32];
  undefined1 local_20c8 [16];
  undefined1 auStack_20b8 [24];
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_20a0;
  undefined1 *local_2088 [2];
  undefined1 local_2078 [16];
  ParserResult local_2068;
  ulong local_2038 [1025];
  undefined1 auVar18 [16];
  
  pOVar11 = (this->m_options).
            super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2108 = (this->m_args).
               super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pAVar14 = (this->m_args).
            super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)local_2108 - (long)pAVar14;
  local_2110 = (lVar12 >> 5) * -0x5555555555555555 +
               ((long)pOVar2 - (long)pOVar11 >> 3) * -0x1111111111111111;
  local_2118 = tokens;
  local_2100 = exeName;
  local_20e8._24_8_ = this;
  if (0x1ff < local_2110) {
    __assert_fail("totalParsers < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/ricab[P]scope_guard/build_O3/_deps/catch2-src/single_include/catch2/catch.hpp"
                  ,0x257c,
                  "virtual InternalParseResult Catch::clara::detail::Parser::parse(const std::string &, const TokenStream &) const"
                 );
  }
  puVar8 = local_2038;
  lVar15 = 0;
  memset(puVar8,0,0x2000);
  if (pOVar11 != pOVar2) {
    lVar15 = 0;
    do {
      lVar15 = lVar15 + 1;
      *puVar8 = (ulong)pOVar11;
      pOVar11 = pOVar11 + 1;
      puVar8 = puVar8 + 2;
    } while (pOVar11 != pOVar2);
  }
  if (pAVar14 != local_2108) {
    uVar13 = lVar12 - 0x60;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar13;
    uVar17 = SUB164(auVar23 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar20 = (undefined4)(uVar13 / 0x180000000);
    auVar18._0_8_ = CONCAT44(uVar20,uVar17);
    auVar18._8_4_ = uVar17;
    auVar18._12_4_ = uVar20;
    auVar19._0_8_ = auVar18._0_8_ >> 6;
    auVar19._8_8_ = auVar18._8_8_ >> 6;
    puVar8 = local_2038 + lVar15 * 2 + 2;
    uVar10 = 0;
    auVar19 = auVar19 ^ _DAT_0016a0c0;
    do {
      auVar21._8_4_ = (int)pAVar14;
      auVar21._0_8_ = pAVar14;
      auVar21._12_4_ = (int)((ulong)pAVar14 >> 0x20);
      auVar22._8_4_ = (int)uVar10;
      auVar22._0_8_ = uVar10;
      auVar22._12_4_ = (int)(uVar10 >> 0x20);
      auVar23 = (auVar22 | _DAT_0016a0b0) ^ _DAT_0016a0c0;
      if ((bool)(~(auVar23._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar23._0_4_ ||
                  auVar19._4_4_ < auVar23._4_4_) & 1)) {
        puVar8[-2] = (ulong)pAVar14;
      }
      if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
          auVar23._12_4_ <= auVar19._12_4_) {
        *puVar8 = auVar21._8_8_ + 0x60;
      }
      uVar10 = uVar10 + 2;
      pAVar14 = pAVar14 + 2;
      puVar8 = puVar8 + 4;
    } while ((uVar13 / 0x60 + 2 & 0xfffffffffffffffe) != uVar10);
  }
  ExeName::set(&local_2068,(ExeName *)(local_20e8._24_8_ + 8),local_2100);
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_00199890;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2068.m_errorMessage._M_dataplus._M_p != &local_2068.m_errorMessage.field_2) {
    operator_delete(local_2068.m_errorMessage._M_dataplus._M_p);
  }
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001998e8;
  this_00 = (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
            (auStack_20b8 + 8);
  local_20c8._0_4_ = 1;
  local_20c8._8_8_ = (local_2118->it)._M_current;
  auStack_20b8._0_8_ = (local_2118->itEnd)._M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (this_00,&local_2118->m_tokenBuffer);
  local_2178._8_4_ = Ok;
  local_2178._0_8_ = &PTR__ResultValueBase_00199788;
  local_2178._16_4_ = local_20c8._0_4_;
  local_2178._24_8_ = local_20c8._8_8_;
  local_2178._32_8_ = auStack_20b8._0_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2178 + 0x28),this_00);
  local_2178._0_8_ = &PTR__BasicResult_00199730;
  local_2138 = &local_2128;
  local_2130 = 0;
  local_2128 = '\0';
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (this_00);
  local_2118 = (TokenStream *)-local_2110;
  do {
    (**(_func_int **)(local_2178._0_8_ + 0x10))(local_2178);
    local_20c8._0_8_ = local_2178._24_8_;
    local_20c8._8_8_ = local_2178._32_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2178 + 0x28));
    uVar7 = auStack_20b8._8_8_;
    uVar6 = auStack_20b8._0_8_;
    uVar5 = local_20c8._8_8_;
    uVar4 = local_20c8._0_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8);
    if ((uVar6 == uVar7) && (uVar4 == uVar5)) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2178._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00199788;
      if (local_2178._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = local_2178._16_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2178 + 0x28));
      }
LAB_0014d4c6:
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00199730;
      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_2138 == &local_2128) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_2127,local_2128);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_2120;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2138;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(uStack_2127,local_2128);
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2130;
      local_2130 = 0;
      local_2128 = '\0';
      local_2138 = &local_2128;
      goto LAB_0014d518;
    }
    if (local_2110 != 0) {
      bVar16 = true;
      uVar10 = 1;
      puVar8 = local_2038 + 1;
      do {
        plVar3 = (long *)puVar8[-1];
        lVar12 = (**(code **)(*plVar3 + 0x20))(plVar3);
        if ((lVar12 == 0) ||
           (uVar13 = *puVar8, uVar9 = (**(code **)(*plVar3 + 0x20))(plVar3), uVar13 < uVar9)) {
          (**(_func_int **)(local_2178._0_8_ + 0x10))(local_2178);
          local_20f8._0_8_ = local_2178._24_8_;
          local_20f8._8_8_ = local_2178._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)local_20e8,
                 (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2178 + 0x28));
          (**(code **)(*plVar3 + 0x18))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8,plVar3,
                     local_2100,local_20f8);
          ResultValueBase<Catch::clara::detail::ParseState>::operator=
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2178,
                     (ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8);
          ::std::__cxx11::string::operator=((string *)&local_2138,(string *)local_2088);
          local_20c8._0_8_ = &PTR__BasicResult_00199730;
          if (local_2088[0] != local_2078) {
            operator_delete(local_2088[0]);
          }
          local_20c8._0_8_ = &PTR__ResultValueBase_00199788;
          if (local_20c8._8_4_ == Ok) {
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(&local_20a0);
          }
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   *)local_20e8);
          if (local_2178._8_4_ != Ok) {
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase.m_type = local_2178._8_4_;
            goto LAB_0014d4c6;
          }
          (**(_func_int **)(local_2178._0_8_ + 0x10))(local_2178);
          if (local_2178._16_4_ != NoMatch) {
            *puVar8 = *puVar8 + 1;
            goto LAB_0014d3db;
          }
        }
        bVar16 = uVar10 < local_2110;
        lVar12 = (long)local_2118 + uVar10;
        uVar10 = uVar10 + 1;
        puVar8 = puVar8 + 2;
      } while (lVar12 != 0);
    }
    bVar16 = false;
LAB_0014d3db:
    (**(_func_int **)(local_2178._0_8_ + 0x10))(local_2178);
    if (local_2178._16_4_ == ShortCircuitAll) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2178._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00199788;
      if (local_2178._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = ShortCircuitAll;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2178 + 0x28));
      }
      goto LAB_0014d4c6;
    }
  } while (bVar16);
  (**(_func_int **)(local_2178._0_8_ + 0x10))();
  local_20c8._0_8_ = local_2178._24_8_;
  local_20c8._8_8_ = local_2178._32_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             auStack_20b8,
             (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2178 + 0x28));
  if (auStack_20b8._0_8_ == auStack_20b8._8_8_) {
    __assert_fail("!m_tokenBuffer.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ricab[P]scope_guard/build_O3/_deps/catch2-src/single_include/catch2/catch.hpp"
                  ,0x22ce,"const Token *Catch::clara::detail::TokenStream::operator->() const");
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20f8,
                   "Unrecognised token: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_20b8._0_8_ + 8));
  BasicResult<Catch::clara::detail::ParseState>::BasicResult
            (__return_storage_ptr__,RuntimeError,(string *)local_20f8);
  if ((pointer)local_20f8._0_8_ != (pointer)local_20e8) {
    operator_delete((void *)local_20f8._0_8_);
  }
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             auStack_20b8);
  local_2178._0_8_ = &PTR__BasicResult_00199730;
  if (local_2138 != &local_2128) {
    operator_delete(local_2138);
  }
LAB_0014d518:
  local_2178._0_8_ = &PTR__ResultValueBase_00199788;
  if (local_2178._8_4_ == Ok) {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2178 + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }